

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

int setbf(match *res,bitfield *bf,ull num)

{
  int len;
  byte bVar1;
  ull uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = num - bf->addend ^ bf->xorend;
  len = bf->sbf[0].len;
  uVar5 = uVar7;
  if (bf->lut != (ull *)0x0) {
    bVar1 = (char)bf->sbf[1].len + (char)len & 0x1f;
    uVar4 = 1 << bVar1;
    uVar3 = 0;
    uVar5 = 0;
    if (0 < 1 << bVar1) {
      uVar5 = (ulong)uVar4;
    }
    for (; uVar6 = uVar5, uVar5 != uVar3; uVar3 = uVar3 + 1) {
      if (bf->lut[uVar3] == uVar7) {
        uVar5 = uVar3;
        uVar6 = uVar3 & 0xffffffff;
        break;
      }
    }
    if ((uint)uVar6 == uVar4) {
      return 0;
    }
  }
  uVar5 = uVar5 >> ((byte)bf->shr & 0x3f);
  setsbf(res,bf->sbf[0].pos,len,uVar5);
  setsbf(res,bf->sbf[1].pos,bf->sbf[1].len,uVar5 >> ((byte)bf->sbf[0].len & 0x3f));
  uVar2 = getbf_as(bf,res->a,res->m);
  return (uint)(uVar2 == num);
}

Assistant:

static int setbf (struct match *res, const struct bitfield *bf, ull num) {
	ull onum = num;
	num = (num - bf->addend) ^ bf->xorend;
	if (bf->lut) {
		int max = 1 << (bf->sbf[0].len + bf->sbf[1].len);
		int j = 0;
		for (j = 0; j < max; j++)
			if (bf->lut[j] == num)
				break;
		if (j == max)
			return 0;
		num = j;
	}
	num >>= bf->shr;
	setsbf(res, bf->sbf[0].pos, bf->sbf[0].len, num);
	num >>= bf->sbf[0].len;
	setsbf(res, bf->sbf[1].pos, bf->sbf[1].len, num);
	ull mask = ~0ull;
	return (getbf_as(bf, res->a, res->m) & mask) == (onum & mask);
}